

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtilTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::utils::ErrorUtil_test_Test::~ErrorUtil_test_Test(ErrorUtil_test_Test *this)

{
  ErrorUtil_test_Test *this_local;
  
  ~ErrorUtil_test_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ErrorUtil, test)
{
    std::ostringstream oss;
    TestLogger logger;
    std::runtime_error stdEx("runtime error");
    std::system_error sysEx(-1, std::generic_category());
    Sender::Exception transportEx("test", 5);
    for (auto i = 0; i < 4; ++i) {
        try {
            switch (i) {
            case 0:
                throw stdEx;
            case 1:
                throw sysEx;
            case 2:
                throw transportEx;
            default:
                ASSERT_EQ(3, i);
                throw 5;
            }
        } catch (...) {
            ErrorUtil::logError(logger, "test");
            switch (i) {
            case 0: {
                ASSERT_EQ("test: runtime error", logger.str());
            } break;
            case 1: {
                ASSERT_TRUE(endsWith(logger.str(), ", code=-1"));
            } break;
            case 2: {
                ASSERT_EQ("test: test, numFailed=5", logger.str());
            } break;
            default: {
                ASSERT_EQ(3, i);
                ASSERT_EQ("test", logger.str());
            } break;
            }
        }
    }
}